

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool tinyusdz::usda::anon_unknown_1::ConstructPrimTreeRec
               (size_t primIdx,
               vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
               *prim_nodes,Prim *destPrim,string *err)

{
  Path *pPVar1;
  pointer pPVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  const_reference rhs;
  string *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
  *this_00;
  size_type *this_01;
  ulong *puVar6;
  vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>> *this_02;
  PrimMeta *this_03;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this_04;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  *this_05;
  reference puVar7;
  size_type sVar8;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_06;
  void *local_1058;
  Value local_1050;
  undefined1 local_1038 [8];
  Prim childPrim;
  unsigned_long *cidx;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_1;
  void *local_c90;
  Value local_c88;
  undefined1 local_c70 [8];
  Prim variantChildPrim;
  string local_918;
  string local_8f8;
  ulong local_8d8;
  int64_t vidx;
  const_iterator __end4;
  const_iterator __begin4;
  vector<long,_std::allocator<long>_> *__range4;
  Variant variant;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>
  *item;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
  *__range3;
  VariantSet variantSet;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>
  *variantNodes;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  variantSets;
  set<long,_std::less<long>,_std::allocator<long>_> variantChildrenIndices;
  Prim prim;
  value_type *node;
  string *err_local;
  Prim *destPrim_local;
  vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
  *prim_nodes_local;
  size_t primIdx_local;
  
  if (destPrim == (Prim *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)err,"`destPrim` is nullptr.\n");
    }
    primIdx_local._7_1_ = 0;
  }
  else {
    sVar5 = ::std::
            vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
            ::size(prim_nodes);
    if (primIdx < sVar5) {
      rhs = ::std::
            vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
            ::operator[](prim_nodes,primIdx);
      Prim::Prim((Prim *)&variantChildrenIndices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &rhs->prim);
      this = Prim::prim_type_name_abi_cxx11_
                       ((Prim *)&variantChildrenIndices._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
      ::std::__cxx11::string::operator=((string *)this,(string *)&rhs->typeName);
      ::std::set<long,_std::less<long>,_std::allocator<long>_>::set
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
             *)&__range2);
      __end2 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>_>
               ::begin(&rhs->variantNodeMap);
      variantNodes = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>
                      *)::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>_>
                        ::end(&rhs->variantNodeMap);
      while (bVar4 = ::std::operator!=(&__end2,(_Self *)&variantNodes), bVar4) {
        variantSet.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)::std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>
                     ::operator*(&__end2);
        VariantSet::VariantSet((VariantSet *)&__range3);
        this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
                   *)(variantSet.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20)
        ;
        __end3 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
                 ::begin(this_00);
        item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>
                *)::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>
                  ::end(this_00);
        while (bVar4 = ::std::operator!=(&__end3,(_Self *)&item), bVar4) {
          variant._primChildren.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)::std::
                        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>
                        ::operator*(&__end3);
          Variant::Variant((Variant *)&__range4);
          this_01 = &variant._primChildren.
                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[1]._path._prop_part._M_string_length;
          __end4 = ::std::vector<long,_std::allocator<long>_>::begin
                             ((vector<long,_std::allocator<long>_> *)this_01);
          vidx = (int64_t)::std::vector<long,_std::allocator<long>_>::end
                                    ((vector<long,_std::allocator<long>_> *)this_01);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                             *)&vidx), bVar4) {
            puVar6 = (ulong *)__gnu_cxx::
                              __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                              ::operator*(&__end4);
            local_8d8 = *puVar6;
            sVar8 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::count
                              ((set<long,_std::less<long>,_std::allocator<long>_> *)
                               &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (key_type_conflict *)&local_8d8);
            uVar3 = local_8d8;
            if (sVar8 != 0) {
              if (err != (string *)0x0) {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_918,"variant primIdx {} is referenced multiple times.\n"
                           ,(allocator *)
                            ((long)&variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header
                                    ._M_node_count + 7));
                fmt::format<long>(&local_8f8,&local_918,(long *)&local_8d8);
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_8f8);
                ::std::__cxx11::string::~string((string *)&local_8f8);
                ::std::__cxx11::string::~string((string *)&local_918);
                ::std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count + 7));
              }
              primIdx_local._7_1_ = 0;
              variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                   1;
              goto LAB_00166442;
            }
            if (((long)local_8d8 < 0) ||
               (sVar5 = ::std::
                        vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                        ::size(prim_nodes), sVar5 < uVar3)) {
              if (err != (string *)0x0) {
                ::std::__cxx11::string::operator=
                          ((string *)err,"primIndex exceeds prim_nodes.size()\n");
              }
              primIdx_local._7_1_ = 0;
              variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                   1;
              goto LAB_00166442;
            }
            local_c90 = (void *)0x0;
            tinyusdz::value::Value::Value<decltype(nullptr)>(&local_c88,&local_c90);
            Prim::Prim((Prim *)local_c70,&local_c88);
            tinyusdz::value::Value::~Value(&local_c88);
            bVar4 = ConstructPrimTreeRec(local_8d8,prim_nodes,(Prim *)local_c70,err);
            if (bVar4) {
              this_02 = (vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>> *)
                        Variant::primChildren((Variant *)&__range4);
              ::std::vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>>::
              emplace_back<tinyusdz::Prim&>(this_02,(Prim *)local_c70);
            }
            else {
              primIdx_local._7_1_ = 0;
            }
            variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._1_3_ = 0
            ;
            variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
                 !bVar4;
            Prim::~Prim((Prim *)local_c70);
            if ((uint)variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                != 0) goto LAB_00166442;
            ::std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)
                       &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (value_type_conflict *)&local_8d8);
            __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
            operator++(&__end4);
          }
          pPVar1 = &(variant._primChildren.
                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage)->_abs_path;
          this_03 = Variant::metas((Variant *)&__range4);
          PrimMetas::operator=(this_03,(PrimMetas *)&pPVar1->_prop_part);
          pPVar2 = variant._primChildren.
                   super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1;
          this_04 = Variant::properties_abi_cxx11_((Variant *)&__range4);
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::operator=(this_04,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                               *)&(pPVar2->_abs_path)._valid);
          ::std::__cxx11::string::operator=
                    ((string *)&__range3,
                     (string *)
                     variantSet.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
          ::std::
          map<std::__cxx11::string,tinyusdz::Variant,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>>
          ::emplace<std::__cxx11::string_const&,tinyusdz::Variant>
                    ((map<std::__cxx11::string,tinyusdz::Variant,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>>
                      *)(variantSet.name.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     variant._primChildren.
                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Variant *)&__range4);
          variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
LAB_00166442:
          Variant::~Variant((Variant *)&__range4);
          if ((uint)variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
              != 0) goto LAB_0016649e;
          ::std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>
          ::operator++(&__end3);
        }
        ::std::
        map<std::__cxx11::string,tinyusdz::VariantSet,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>>
        ::emplace<std::__cxx11::string_const&,tinyusdz::VariantSet>
                  ((map<std::__cxx11::string,tinyusdz::VariantSet,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>>
                    *)&__range2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   variantSet.variantSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (VariantSet *)&__range3);
        variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
LAB_0016649e:
        VariantSet::~VariantSet((VariantSet *)&__range3);
        if ((uint)variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
            0) goto LAB_00166658;
        ::std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::usda::(anonymous_namespace)::VariantNode>_>_>_>_>
        ::operator++(&__end2);
      }
      this_05 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                 *)Prim::variantSets_abi_cxx11_
                             ((Prim *)&variantChildrenIndices._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
      ::operator=(this_05,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                           *)&__range2);
      __end2_1._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rhs->children);
      cidx = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rhs->children);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)&cidx), bVar4) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end2_1);
        childPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count = *puVar7;
        sVar8 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::count
                          ((set<long,_std::less<long>,_std::allocator<long>_> *)
                           &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (key_type_conflict *)
                           &childPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        if (sVar8 == 0) {
          local_1058 = (void *)0x0;
          tinyusdz::value::Value::Value<decltype(nullptr)>(&local_1050,&local_1058);
          Prim::Prim((Prim *)local_1038,&local_1050);
          tinyusdz::value::Value::~Value(&local_1050);
          bVar4 = ConstructPrimTreeRec(*puVar7,prim_nodes,(Prim *)local_1038,err);
          if (bVar4) {
            this_06 = Prim::children((Prim *)&variantChildrenIndices._M_t._M_impl.
                                              super__Rb_tree_header._M_node_count);
            ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
            emplace_back<tinyusdz::Prim>(this_06,(Prim *)local_1038);
          }
          else {
            primIdx_local._7_1_ = 0;
          }
          variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._1_3_ = 0;
          variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
               !bVar4;
          Prim::~Prim((Prim *)local_1038);
          if ((uint)variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
              != 0) goto LAB_00166658;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end2_1);
      }
      Prim::operator=(destPrim,(Prim *)&variantChildrenIndices._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count);
      primIdx_local._7_1_ = 1;
      variantChildPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
LAB_00166658:
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
              *)&__range2);
      ::std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 &variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Prim::~Prim((Prim *)&variantChildrenIndices._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator=((string *)err,"primIndex exceeds prim_nodes.size()\n");
      }
      primIdx_local._7_1_ = 0;
    }
  }
  return (bool)(primIdx_local._7_1_ & 1);
}

Assistant:

bool ConstructPrimTreeRec(const size_t primIdx,
                        const std::vector<PrimNode> &prim_nodes,
                        Prim *destPrim,
                        std::string *err) {

  if (!destPrim) {
    if (err) {
      (*err) = "`destPrim` is nullptr.\n";
    }
    return false;
  }

  if (primIdx >= prim_nodes.size()) {
    if (err) {
      (*err) = "primIndex exceeds prim_nodes.size()\n";
    }
    return false;
  }

  const auto &node = prim_nodes[primIdx];

  Prim prim(node.prim);
  prim.prim_type_name() = node.typeName;

  DCOUT("prim[" << primIdx << "].type = " << node.prim.type_name());
  DCOUT("prim[" << primIdx << "].variantNodeMap.size = " << node.variantNodeMap.size());
  //prim.prim_id() = int64_t(idx);

  // Firstly process variants.
  std::set<int64_t> variantChildrenIndices; // record variantChildren indices

  std::map<std::string, VariantSet> variantSets;
  for (const auto &variantNodes : node.variantNodeMap) {
    DCOUT("variantSet " << variantNodes.first);
    VariantSet variantSet;
    for (const auto &item : variantNodes.second) {
      DCOUT("variant " << item.first);
      Variant variant;
      for (const int64_t vidx : item.second.primChildren) {
        if (variantChildrenIndices.count(vidx)) {
          // Duplicated variant childrenIndices
          if (err) {
            (*err) = fmt::format("variant primIdx {} is referenced multiple times.\n", vidx);
          }
          return false;
        } else {
          // Add prim to variants
          if ((vidx >= 0) && (size_t(vidx) <= prim_nodes.size())) {

            Prim variantChildPrim(value::Value(nullptr)); // dummy
            if (!ConstructPrimTreeRec(size_t(vidx), prim_nodes, &variantChildPrim, err)) {
              return false;
            }

            DCOUT(fmt::format("Added prim {} to variantSet {} : variant {}", variantChildPrim.element_name(), variantNodes.first, item.first));
            variant.primChildren().emplace_back(variantChildPrim);
          } else {
            if (err) {
              (*err) = "primIndex exceeds prim_nodes.size()\n";
            }
            return false;
          }

          variantChildrenIndices.insert(vidx);
        }
      }
      variant.metas() = std::move(item.second.metas);
      variant.properties() = std::move(item.second.props);

      variantSet.name = variantNodes.first;
      variantSet.variantSet.emplace(item.first, std::move(variant));
    }
    variantSets.emplace(variantNodes.first, std::move(variantSet));
  }
  prim.variantSets() = std::move(variantSets);

  for (const auto &cidx : node.children) {
    if (variantChildrenIndices.count(int64_t(cidx))) {
      // Prim is processed
      continue;
    }

    Prim childPrim(value::Value(nullptr)); // dummy
    if (!ConstructPrimTreeRec(cidx, prim_nodes, &childPrim, err)) {
      return false;
    }

    prim.children().emplace_back(std::move(childPrim));
  }

  (*destPrim) = std::move(prim);
  return true;
}